

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subqueryref.cpp
# Opt level: O3

string * __thiscall
duckdb::SubqueryRef::ToString_abi_cxx11_(string *__return_storage_ptr__,SubqueryRef *this)

{
  long lVar1;
  pointer pSVar2;
  long *plVar3;
  long *plVar4;
  string result;
  long *local_a0;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pSVar2 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->(&this->subquery);
  (*(pSVar2->super_SQLStatement)._vptr_SQLStatement[2])(local_40);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x1e0f04c);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_80);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_90 = *plVar4;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar4;
    local_a0 = (long *)*plVar3;
  }
  lVar1 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_a0,lVar1 + (long)local_a0);
  TableRef::BaseToString
            (__return_storage_ptr__,&this->super_TableRef,&local_60,
             &(this->super_TableRef).column_name_alias);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

string SubqueryRef::ToString() const {
	string result = "(" + subquery->ToString() + ")";
	return BaseToString(result, column_name_alias);
}